

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shapes_test.cpp
# Opt level: O3

void __thiscall Triangle_Reintersect_Test::TestBody(Triangle_Reintersect_Test *this)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined8 uVar5;
  undefined8 uVar6;
  bool bVar7;
  uint uVar8;
  Triangle *pTVar9;
  float *pfVar10;
  Point3f *pPVar11;
  byte bVar12;
  ulong uVar13;
  Sphere *this_00;
  char *in_R9;
  int j;
  int iVar14;
  int k;
  int iVar15;
  float fVar16;
  undefined1 auVar17 [16];
  Point2f u;
  double dVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 in_ZMM4 [64];
  AssertionResult gtest_ar__1;
  ShapeHandle tri;
  AssertionResult gtest_ar_;
  optional<pbrt::ShapeSample> ts;
  optional<pbrt::ShapeIntersection> si;
  AssertHelper local_3c0;
  internal local_3b8 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_3b0;
  float local_3a4;
  undefined1 local_3a0 [8];
  undefined1 local_398 [8];
  ulong local_390;
  long local_388;
  TaggedPointer<pbrt::Sphere,_pbrt::Cylinder,_pbrt::Disk,_pbrt::Triangle,_pbrt::BilinearPatch,_pbrt::Curve>
  local_380;
  float local_374;
  AssertHelper local_370;
  undefined8 local_368;
  long local_360;
  Ray local_358;
  Ray local_328;
  _Any_data local_300;
  code *local_2f0;
  code *local_2e8;
  Tuple3<pbrt::Vector3,_float> local_2e0;
  undefined1 local_2d0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  aaStack_2c0 [15];
  bool local_1d0;
  aligned_storage_t<sizeof(pbrt::ShapeSample),_alignof(pbrt::ShapeSample)> local_1c8;
  char local_170;
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [256];
  bool local_38;
  
  local_360 = 0;
  do {
    local_300._8_8_ = 0;
    uVar13 = ((ulong)(local_360 * 0x7fb5d329728ea185) >> 0x1b ^ local_360 * 0x7fb5d329728ea185) *
             -0x7e25210b43d22bb3;
    local_388 = local_360 * 2 + 1;
    local_300._M_unused._M_object = &local_390;
    local_2e8 = std::
                _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp:158:45)>
                ::_M_invoke;
    local_2f0 = std::
                _Function_handler<float_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp:158:45)>
                ::_M_manager;
    local_390 = ((uVar13 >> 0x21 ^ uVar13) + 1) * 0x5851f42d4c957f2d +
                local_360 * -0x4f5c17a566d501a4 + 1;
    pTVar9 = GetRandomTriangle((function<float_()> *)&local_300);
    local_380.bits = (ulong)pTVar9 | 0x4000000000000;
    if (local_2f0 != (code *)0x0) {
      (*local_2f0)(&local_300,&local_300,__destroy_functor);
    }
    this_00 = (Sphere *)(local_380.bits & 0xffffffffffff);
    if (this_00 != (Sphere *)0x0) {
      uVar13 = local_390 * 0x5851f42d4c957f2d + local_388;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_390;
      auVar22._8_8_ = 0;
      auVar22._0_8_ = uVar13;
      auVar20 = vpunpcklqdq_avx(auVar19,auVar22);
      auVar17 = vpsrlvq_avx2(auVar20,_DAT_0054e5b0);
      auVar19 = vpsrlvq_avx2(auVar20,_DAT_0054e5c0);
      auVar20 = vpsrlq_avx(auVar20,0x3b);
      auVar20 = vpshufd_avx(auVar20,0xe8);
      local_390 = uVar13 * 0x5851f42d4c957f2d + local_388;
      auVar17 = vpshufd_avx(auVar17 ^ auVar19,0xe8);
      auVar20 = vprorvd_avx512vl(auVar17,auVar20);
      auVar17 = vcvtudq2ps_avx512vl(auVar20);
      auVar20._8_4_ = 0x2f800000;
      auVar20._0_8_ = 0x2f8000002f800000;
      auVar20._12_4_ = 0x2f800000;
      auVar20 = vmulps_avx512vl(auVar17,auVar20);
      auVar17._8_4_ = 0x3f7fffff;
      auVar17._0_8_ = 0x3f7fffff3f7fffff;
      auVar17._12_4_ = 0x3f7fffff;
      auVar20 = vminps_avx512vl(auVar20,auVar17);
      u.super_Tuple2<pbrt::Point2,_float> = auVar20._0_8_;
      uVar8 = (uint)(ushort)(local_380.bits >> 0x30);
      if (local_380.bits <
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x4000000000000) {
        if (local_380.bits >> 0x31 == 0) {
          pbrt::Sphere::Sample((optional<pbrt::ShapeSample> *)&local_1c8.__align,this_00,u);
        }
        else if (uVar8 == 2) {
          pbrt::Cylinder::Sample
                    ((optional<pbrt::ShapeSample> *)&local_1c8.__align,(Cylinder *)this_00,u);
        }
        else {
          pbrt::Disk::Sample((optional<pbrt::ShapeSample> *)&local_1c8.__align,(Disk *)this_00,u);
        }
      }
      else {
        uVar8 = uVar8 - 3;
        if (uVar8 < 2) {
          pbrt::Triangle::Sample
                    ((optional<pbrt::ShapeSample> *)&local_1c8.__align,(Triangle *)this_00,u);
        }
        else if (uVar8 == 2) {
          pbrt::BilinearPatch::Sample
                    ((optional<pbrt::ShapeSample> *)&local_1c8.__align,(BilinearPatch *)this_00,u);
        }
        else {
          pbrt::Curve::Sample((optional<pbrt::ShapeSample> *)&local_1c8.__align,(Curve *)this_00,u);
        }
      }
      local_2d0[0] = local_170;
      local_2d0._8_4_ = 0.0;
      local_2d0._12_4_ = 0.0;
      if (local_170 == '\0') {
        testing::Message::Message((Message *)&local_328);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  ((string *)local_138,(internal *)local_2d0,(AssertionResult *)"ts.has_value()",
                   "false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  ((AssertHelper *)&local_358,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                   ,0xa7,(char *)local_138._0_8_);
        testing::internal::AssertHelper::operator=((AssertHelper *)&local_358,(Message *)&local_328)
        ;
        testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_358);
        if (local_138._0_8_ != (long)local_138 + 0x10) {
          operator_delete((void *)local_138._0_8_,local_138._16_8_ + 1);
        }
        if ((((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_328.o.super_Tuple3<pbrt::Point3,_float>._0_8_ !=
              (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) &&
            (bVar7 = testing::internal::IsTrue(true), bVar7)) &&
           ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
            local_328.o.super_Tuple3<pbrt::Point3,_float>._0_8_ !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
          (**(code **)(*(long *)local_328.o.super_Tuple3<pbrt::Point3,_float>._0_8_ + 8))();
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_2d0 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        bVar7 = true;
      }
      else {
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)(local_2d0 + 8),
                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
        iVar14 = 0;
        local_368 = (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        local_3a4 = 0.0;
        do {
          uVar8 = (uint)(local_390 >> 0x2d) ^ (uint)(local_390 >> 0x1b);
          bVar12 = (byte)(local_390 >> 0x3b);
          auVar20 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar8 >> bVar12 | uVar8 << 0x20 - bVar12);
          auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),
                               SUB6416(ZEXT464(0x3f7fffff),0));
          auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                                    ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
          local_390 = local_390 * 0x5851f42d4c957f2d + local_388;
          dVar18 = pow(10.0,(double)auVar20._0_4_);
          pfVar10 = (float *)&local_368;
          if ((iVar14 != 0) && (pfVar10 = (float *)((long)&local_368 + 4), iVar14 != 1)) {
            pfVar10 = &local_3a4;
          }
          iVar14 = iVar14 + 1;
          *pfVar10 = (float)dVar18;
        } while (iVar14 != 3);
        if (local_170 == '\0') {
          pbrt::LogFatal<char_const(&)[4]>
                    (Fatal,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/util/pstd.h"
                     ,0xea,"Check failed: %s",(char (*) [4])0x56907c);
        }
        auVar4._4_8_ = local_1c8._4_8_;
        auVar4._0_4_ = local_1c8._0_4_;
        auVar4._12_4_ = local_1c8._12_4_;
        in_ZMM4 = ZEXT864((ulong)local_1c8._4_8_);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_368;
        auVar20 = vinsertps_avx(auVar4,ZEXT416((uint)local_1c8._12_4_),0x10);
        local_328.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = local_368;
        local_328.o.super_Tuple3<pbrt::Point3,_float>.z = local_3a4;
        auVar25._0_4_ = (float)local_1c8._4_8_ + auVar20._0_4_;
        auVar25._4_4_ = (float)((ulong)local_1c8._4_8_ >> 0x20) + auVar20._4_4_;
        auVar25._8_4_ = auVar20._8_4_ + 0.0;
        auVar25._12_4_ = auVar20._12_4_ + 0.0;
        auVar1._8_4_ = 0x3f000000;
        auVar1._0_8_ = 0x3f0000003f000000;
        auVar1._12_4_ = 0x3f000000;
        auVar20 = vmulps_avx512vl(auVar25,auVar1);
        local_328.d.super_Tuple3<pbrt::Vector3,_float>.z =
             ((float)local_1c8._16_4_ + (float)local_1c8._20_4_) * 0.5 - local_3a4;
        auVar20 = vsubps_avx(auVar20,auVar23);
        local_328.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar20);
        local_328.time = 0.0;
        local_328.medium.
        super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
        .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                 )0;
        pbrt::ShapeHandle::Intersect
                  ((optional<pbrt::ShapeIntersection> *)local_138,(ShapeHandle *)&local_380,
                   &local_328,INFINITY);
        if (local_38 == true) {
          iVar14 = 0;
          do {
            uVar13 = local_390 * 0x5851f42d4c957f2d + local_388;
            auVar21._8_8_ = 0;
            auVar21._0_8_ = local_390;
            auVar24._8_8_ = 0;
            auVar24._0_8_ = uVar13;
            auVar20 = vpunpcklqdq_avx(auVar24,auVar21);
            auVar17 = vpsrlvq_avx2(auVar20,_DAT_0054e5c0);
            auVar19 = vpsrlvq_avx2(auVar20,_DAT_0054e5b0);
            auVar20 = vpsrlq_avx(auVar20,0x3b);
            auVar20 = vpshufd_avx(auVar20,0xe8);
            local_390 = uVar13 * 0x5851f42d4c957f2d + local_388;
            auVar17 = vpshufd_avx(auVar19 ^ auVar17,0xe8);
            auVar20 = vprorvd_avx512vl(auVar17,auVar20);
            auVar20 = vcvtudq2ps_avx512vl(auVar20);
            auVar2._8_4_ = 0x2f800000;
            auVar2._0_8_ = 0x2f8000002f800000;
            auVar2._12_4_ = 0x2f800000;
            auVar17 = vmulps_avx512vl(auVar20,auVar2);
            auVar3._8_4_ = 0x3f7fffff;
            auVar3._0_8_ = 0x3f7fffff3f7fffff;
            auVar3._12_4_ = 0x3f7fffff;
            uVar13 = vcmpps_avx512vl(auVar17,auVar3,1);
            auVar20 = vmovshdup_avx(auVar17);
            bVar12 = (byte)(uVar13 >> 1);
            local_148 = vfmadd132ss_fma(ZEXT416((uint)(bVar12 & 1) * auVar20._0_4_ +
                                                (uint)!(bool)(bVar12 & 1) * 0x3f7fffff),
                                        SUB6416(ZEXT464(0x3f800000),0),ZEXT416(0xc0000000));
            auVar20 = vfnmadd213ss_fma(local_148,local_148,SUB6416(ZEXT464(0x3f800000),0));
            auVar20 = vmaxss_avx(auVar20,ZEXT416(0));
            auVar20 = vsqrtss_avx(auVar20,auVar20);
            local_374 = auVar20._0_4_;
            fVar16 = (float)((uint)((byte)uVar13 & 1) * (int)(auVar17._0_4_ * 6.2831855) +
                            (uint)!(bool)((byte)uVar13 & 1) * 0x40c90fda);
            local_168 = ZEXT416((uint)fVar16);
            fVar16 = cosf(fVar16);
            local_158 = ZEXT416((uint)(fVar16 * local_374));
            fVar16 = sinf((float)local_168._0_4_);
            auVar20 = vinsertps_avx(local_158,ZEXT416((uint)(fVar16 * local_374)),0x10);
            local_2e0._0_8_ = vmovlps_avx(auVar20);
            local_2e0.z = (float)local_148._0_4_;
            pbrt::Interaction::SpawnRay
                      ((RayDifferential *)local_2d0,(Interaction *)local_138,(Vector3f *)&local_2e0)
            ;
            uVar5 = local_2d0._0_8_;
            local_3a0._0_4_ = 0x7f800000;
            local_2d0._0_8_ = local_380.bits;
            uVar6 = local_2d0._0_8_;
            local_2d0._0_4_ = (undefined4)uVar5;
            local_2d0._4_4_ = SUB84(uVar5,4);
            local_358.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_2d0._0_4_;
            local_358.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_2d0._4_4_;
            local_358.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_2d0._8_4_;
            local_358.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2d0._12_4_;
            local_358.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )aaStack_2c0[1]._0_8_;
            local_2d0._0_8_ = uVar6;
            bVar7 = pbrt::DispatchSplit<6>::operator()
                              ((DispatchSplit<6> *)&local_3c0,
                               (anon_struct_8_0_00000001_for___align *)&local_358,
                               (Point3f *)local_3a0,(RayDifferential *)local_2d0,
                               local_380.bits >> 0x30);
            local_3b8[0] = (internal)!bVar7;
            local_3b0.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar7) {
              testing::Message::Message((Message *)local_3a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2d0,local_3b8,(AssertionResult *)"tri.IntersectP(rOut)",
                         "true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xc0,(char *)local_2d0._0_8_);
              testing::internal::AssertHelper::operator=(&local_3c0,(Message *)local_3a0);
              testing::internal::AssertHelper::~AssertHelper(&local_3c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._0_8_ != aaStack_2c0) {
                operator_delete((void *)local_2d0._0_8_,
                                CONCAT44(aaStack_2c0[0]._M_allocated_capacity._4_4_,
                                         (undefined4)aaStack_2c0[0]._M_allocated_capacity) + 1);
              }
              if (((local_3a0 != (undefined1  [8])0x0) &&
                  (bVar7 = testing::internal::IsTrue(true), bVar7)) &&
                 (local_3a0 != (undefined1  [8])0x0)) {
                (**(code **)(*(long *)local_3a0 + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            pbrt::ShapeHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)local_2d0,(ShapeHandle *)&local_380,
                       &local_358,INFINITY);
            local_3b8[0] = (internal)(local_1d0 ^ 1);
            local_3b0.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_1d0 != false) {
              testing::Message::Message((Message *)local_3a0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2d0,local_3b8,
                         (AssertionResult *)"tri.Intersect(rOut).has_value()","true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_3c0,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xc1,(char *)local_2d0._0_8_);
              testing::internal::AssertHelper::operator=(&local_3c0,(Message *)local_3a0);
              testing::internal::AssertHelper::~AssertHelper(&local_3c0);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._0_8_ != aaStack_2c0) {
                operator_delete((void *)local_2d0._0_8_,
                                CONCAT44(aaStack_2c0[0]._M_allocated_capacity._4_4_,
                                         (undefined4)aaStack_2c0[0]._M_allocated_capacity) + 1);
              }
              if (((local_3a0 != (undefined1  [8])0x0) &&
                  (bVar7 = testing::internal::IsTrue(true), bVar7)) &&
                 (local_3a0 != (undefined1  [8])0x0)) {
                (**(code **)(*(long *)local_3a0 + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            local_3a0._0_4_ = 0.0;
            local_3a0._4_4_ = 0.0;
            iVar15 = 0;
            local_398._0_4_ = 0.0;
            do {
              uVar8 = (uint)(local_390 >> 0x2d) ^ (uint)(local_390 >> 0x1b);
              bVar12 = (byte)(local_390 >> 0x3b);
              auVar20 = vcvtusi2ss_avx512f(in_ZMM4._0_16_,uVar8 >> bVar12 | uVar8 << 0x20 - bVar12);
              auVar20 = vminss_avx(ZEXT416((uint)(auVar20._0_4_ * 2.3283064e-10)),
                                   SUB6416(ZEXT464(0x3f7fffff),0));
              auVar20 = vfmadd231ss_fma(ZEXT416((uint)(auVar20._0_4_ * 8.0)),
                                        ZEXT416((uint)(1.0 - auVar20._0_4_)),ZEXT416(0xc1000000));
              local_390 = local_390 * 0x5851f42d4c957f2d + local_388;
              dVar18 = pow(10.0,(double)auVar20._0_4_);
              pPVar11 = (Point3f *)local_3a0;
              if ((iVar15 != 0) && (pPVar11 = (Point3f *)(local_3a0 + 4), iVar15 != 1)) {
                pPVar11 = (Point3f *)local_398;
              }
              iVar15 = iVar15 + 1;
              (pPVar11->super_Tuple3<pbrt::Point3,_float>).x = (float)dVar18;
            } while (iVar15 != 3);
            pbrt::Interaction::SpawnRayTo
                      ((Ray *)local_2d0,(Interaction *)local_138,(Point3f *)local_3a0);
            uVar5 = local_2d0._0_8_;
            local_3c0.data_._0_4_ = 0x3f800000;
            local_2d0._0_8_ = local_380.bits;
            uVar6 = local_2d0._0_8_;
            local_2d0._0_4_ = (undefined4)uVar5;
            local_2d0._4_4_ = SUB84(uVar5,4);
            local_358.o.super_Tuple3<pbrt::Point3,_float>.x = (float)local_2d0._0_4_;
            local_358.o.super_Tuple3<pbrt::Point3,_float>.y = (float)local_2d0._4_4_;
            local_358.o.super_Tuple3<pbrt::Point3,_float>.z = (float)local_2d0._8_4_;
            local_358.d.super_Tuple3<pbrt::Vector3,_float>.x = (float)local_2d0._12_4_;
            local_358.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
            .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                     )(TaggedPointer<pbrt::HomogeneousMedium,_pbrt::CuboidMedium<pbrt::UniformGridMediumProvider>,_pbrt::CuboidMedium<pbrt::CloudMediumProvider>,_pbrt::CuboidMedium<pbrt::NanoVDBMediumProvider>_>
                       )aaStack_2c0[1]._0_8_;
            local_2d0._0_8_ = uVar6;
            bVar7 = pbrt::DispatchSplit<6>::operator()
                              ((DispatchSplit<6> *)&local_370,
                               (anon_struct_8_0_00000001_for___align *)&local_358,&local_3c0,
                               (Ray *)local_2d0,local_380.bits >> 0x30);
            local_3b8[0] = (internal)!bVar7;
            local_3b0.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (bVar7) {
              testing::Message::Message((Message *)&local_3c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2d0,local_3b8,(AssertionResult *)"tri.IntersectP(rOut, 1)",
                         "true","false",in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_370,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xc9,(char *)local_2d0._0_8_);
              testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_3c0);
              testing::internal::AssertHelper::~AssertHelper(&local_370);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._0_8_ != aaStack_2c0) {
                operator_delete((void *)local_2d0._0_8_,
                                CONCAT44(aaStack_2c0[0]._M_allocated_capacity._4_4_,
                                         (undefined4)aaStack_2c0[0]._M_allocated_capacity) + 1);
              }
              if (((CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != 0) &&
                  (bVar7 = testing::internal::IsTrue(true), bVar7)) &&
                 ((long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            pbrt::ShapeHandle::Intersect
                      ((optional<pbrt::ShapeIntersection> *)local_2d0,(ShapeHandle *)&local_380,
                       &local_358,1.0);
            local_3b8[0] = (internal)(local_1d0 ^ 1);
            local_3b0.ptr_ =
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
            if (local_1d0 != false) {
              testing::Message::Message((Message *)&local_3c0);
              testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                        ((string *)local_2d0,local_3b8,
                         (AssertionResult *)"tri.Intersect(rOut, 1).has_value()","true","false",
                         in_R9);
              testing::internal::AssertHelper::AssertHelper
                        (&local_370,kNonFatalFailure,
                         "/workspace/llm4binary/github/license_all_cmakelists_25/mmp[P]pbrt-v4-ci-testing/src/pbrt/shapes_test.cpp"
                         ,0xca,(char *)local_2d0._0_8_);
              testing::internal::AssertHelper::operator=(&local_370,(Message *)&local_3c0);
              testing::internal::AssertHelper::~AssertHelper(&local_370);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2d0._0_8_ != aaStack_2c0) {
                operator_delete((void *)local_2d0._0_8_,
                                CONCAT44(aaStack_2c0[0]._M_allocated_capacity._4_4_,
                                         (undefined4)aaStack_2c0[0]._M_allocated_capacity) + 1);
              }
              if (((CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != 0) &&
                  (bVar7 = testing::internal::IsTrue(true), bVar7)) &&
                 ((long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) != (long *)0x0)) {
                (**(code **)(*(long *)CONCAT44(local_3c0.data_._4_4_,local_3c0.data_._0_4_) + 8))();
              }
            }
            testing::internal::
            scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::reset(&local_3b0,
                    (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
            iVar14 = iVar14 + 1;
          } while (iVar14 != 1000);
        }
        bVar7 = false;
      }
      if (bVar7) {
        return;
      }
    }
    local_360 = local_360 + 1;
    if (local_360 == 1000) {
      return;
    }
  } while( true );
}

Assistant:

TEST(Triangle, Reintersect) {
    for (int i = 0; i < 1000; ++i) {
        RNG rng(i);
        ShapeHandle tri = GetRandomTriangle([&]() { return pExp(rng); });
        if (!tri)
            continue;

        // Sample a point on the triangle surface to shoot the ray toward.
        Point2f u;
        u[0] = rng.Uniform<Float>();
        u[1] = rng.Uniform<Float>();
        auto ts = tri.Sample(u);
        ASSERT_TRUE(ts.has_value());

        // Choose a ray origin.
        Point3f o;
        for (int j = 0; j < 3; ++j)
            o[j] = pExp(rng);

        // Intersect the ray with the triangle.
        Ray r(o, ts->intr.p() - o);
        auto si = tri.Intersect(r);
        if (!si)
            // We should almost always find an intersection, but rarely
            // miss, due to round-off error. Just do another go-around in
            // this case.
            continue;
        SurfaceInteraction &isect = si->intr;

        // Now trace a bunch of rays leaving the intersection point.
        for (int j = 0; j < 1000; ++j) {
            // Random direction leaving the intersection point.
            Point2f u;
            u[0] = rng.Uniform<Float>();
            u[1] = rng.Uniform<Float>();
            Vector3f w = SampleUniformSphere(u);
            Ray rOut = isect.SpawnRay(w);
            EXPECT_FALSE(tri.IntersectP(rOut));
            EXPECT_FALSE(tri.Intersect(rOut).has_value());

            // Choose a random point to trace rays to.
            Point3f p2;
            for (int k = 0; k < 3; ++k)
                p2[k] = pExp(rng);
            rOut = isect.SpawnRayTo(p2);

            EXPECT_FALSE(tri.IntersectP(rOut, 1));
            EXPECT_FALSE(tri.Intersect(rOut, 1).has_value());
        }
    }
}